

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O3

Action __thiscall
psy::C::TypeChecker::visitBinaryExpression_Addition<psy::C::BinaryExpressionSyntax>
          (TypeChecker *this,BinaryExpressionSyntax *node,Type *leftTy,Type *rightTy)

{
  bool bVar1;
  TypeKind TVar2;
  Action AVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Type *pTVar6;
  SyntaxToken SStack_58;
  
  bVar1 = isArithmeticType(leftTy);
  if (bVar1) {
    bVar1 = isArithmeticType(rightTy);
    if (!bVar1) goto LAB_002e27df;
    iVar4 = (*leftTy->_vptr_Type[5])(leftTy);
    iVar5 = (*rightTy->_vptr_Type[5])(rightTy);
    pTVar6 = &determineCommonRealType
                        (this,(BasicType *)CONCAT44(extraout_var,iVar4),
                         (BasicType *)CONCAT44(extraout_var_00,iVar5))->super_Type;
    this->ty_ = pTVar6;
LAB_002e2819:
    AVar3 = Skip;
  }
  else {
LAB_002e27df:
    TVar2 = Type::kind(leftTy);
    if (TVar2 == Pointer) {
      bVar1 = isIntegerType(rightTy);
      if (bVar1) {
        this->ty_ = leftTy;
        goto LAB_002e2819;
      }
    }
    TVar2 = Type::kind(rightTy);
    if (TVar2 == Pointer) {
      bVar1 = isIntegerType(leftTy);
      if (bVar1) {
        this->ty_ = rightTy;
        goto LAB_002e2819;
      }
    }
    (*(node->super_ExpressionSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0xda])
              (&SStack_58,node);
    DiagnosticsReporter::InvalidOperator(&this->diagReporter_,&SStack_58);
    SyntaxToken::~SyntaxToken(&SStack_58);
    AVar3 = Quit;
  }
  return AVar3;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitBinaryExpression_Addition(
        const BinaryLikeExprNodeT* node,
        const Type* leftTy,
        const Type* rightTy)
{
    if (isArithmeticType(leftTy) && isArithmeticType(rightTy)) {
        ty_ = determineCommonRealType(leftTy->asBasicType(), rightTy->asBasicType());
    } else if (leftTy->kind() == TypeKind::Pointer
               && isIntegerType(rightTy)) {
        ty_ = leftTy;
    } else if (rightTy->kind() == TypeKind::Pointer
                && isIntegerType(leftTy)) {
        ty_ = rightTy;
    } else {
        diagReporter_.InvalidOperator(node->operatorToken());
        return Action::Quit;
    }

    return Action::Skip;
}